

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cc
# Opt level: O0

Statistic * __thiscall Statistic::operator=(Statistic *this,Statistic *stat)

{
  size_t sVar1;
  char *pcVar2;
  Statistic *stat_local;
  Statistic *this_local;
  
  if (this != stat) {
    if (this->psKey != (char *)0x0) {
      operator_delete__(this->psKey);
    }
    sVar1 = strlen(stat->psKey);
    pcVar2 = (char *)operator_new__(sVar1 + 1);
    this->psKey = pcVar2;
    strcpy(this->psKey,stat->psKey);
    this->iValue = stat->iValue;
  }
  return this;
}

Assistant:

Statistic& Statistic::operator=(const Statistic &stat)
{
   if (this==&stat)
      return *this;

   delete [] psKey;
   psKey = new char[strlen(stat.psKey)+1];
   strcpy (psKey, stat.psKey);

   iValue = stat.iValue;

   return *this;
}